

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_bit(ly_ctx *ctx,yang_type *typ,lys_type_bit *bit,char *value)

{
  int iVar1;
  char *id;
  uint uVar2;
  long lVar3;
  int iVar4;
  
  typ->base = LY_TYPE_BITS;
  id = lydict_insert_zc(ctx,value);
  bit->name = id;
  iVar4 = 0;
  iVar1 = lyp_check_identifier(ctx,id,LY_IDENT_SIMPLE,(lys_module *)0x0,(lys_node *)0x0);
  if (iVar1 == 0) {
    uVar2 = (typ->type->info).bits.count - 1;
    if (0 < (int)uVar2) {
      lVar3 = 0;
      do {
        if (*(char **)((long)&((typ->type->info).bits.bit)->name + lVar3) == bit->name) {
          ly_vlog(ctx,LYE_BITS_DUPNAME,LY_VLOG_NONE,(void *)0x0);
          goto LAB_00153938;
        }
        lVar3 = lVar3 + 0x30;
      } while ((ulong)uVar2 * 0x30 != lVar3);
      iVar4 = 0;
    }
  }
  else {
LAB_00153938:
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
yang_read_bit(struct ly_ctx *ctx, struct yang_type *typ, struct lys_type_bit *bit, char *value)
{
    int i, j;

    typ->base = LY_TYPE_BITS;
    bit->name = lydict_insert_zc(ctx, value);
    if (lyp_check_identifier(ctx, bit->name, LY_IDENT_SIMPLE, NULL, NULL)) {
        goto error;
    }

    j = typ->type->info.bits.count - 1;
    /* check the name uniqueness */
    for (i = 0; i < j; i++) {
        if (ly_strequal(typ->type->info.bits.bit[i].name, bit->name, 1)) {
            LOGVAL(ctx, LYE_BITS_DUPNAME, LY_VLOG_NONE, NULL, bit->name);
            goto error;
        }
    }
    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}